

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer,size_t alignment)

{
  size_t sVar1;
  ulong in_RAX;
  long lVar2;
  undefined8 uStack_28;
  
  sVar1 = buffer->size;
  lVar2 = (-alignment & (alignment + sVar1) - 1) - sVar1;
  if (lVar2 != 0) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      sysbvm_dynarray_addAll(buffer,1,(void *)((long)&uStack_28 + 7));
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer, size_t alignment)
{
    size_t offset = buffer->size;
    size_t alignedSize = (buffer->size + alignment - 1) & (-alignment);
    size_t padding = alignedSize - buffer->size;
    for(size_t i = 0; i < padding; ++i)
        sysbvm_dwarf_encodeByte(buffer, 0);
    return offset;
}